

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O0

int __thiscall deqp::egl::MemoryStressCase::init(MemoryStressCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  deUint32 err;
  deBool dVar2;
  CommandLine *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  NotSupportedError *this_03;
  NativeDisplay *nativeDisplay;
  EGLDisplay pvVar3;
  TestError *this_04;
  allocator<char> local_1e9;
  string local_1e8;
  MessageBuilder local_1b8;
  undefined8 local_38;
  EGLint attribList [5];
  int local_1c;
  Library *pLStack_18;
  EGLint configCount;
  Library *egl;
  MemoryStressCase *this_local;
  
  egl = (Library *)this;
  pLStack_18 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_1c = 0;
  local_38 = 0x100003033;
  attribList[0] = 0x3040;
  attribList[1] = 4;
  attribList[2] = 0x3038;
  this_00 = tcu::TestContext::getCommandLine
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar1 = tcu::CommandLine::isOutOfMemoryTestEnabled(this_00);
  if (!bVar1) {
    this_01 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    this_02 = tcu::MessageBuilder::operator<<
                        (&local_1b8,
                         (char (*) [98])
                         "Tests that exhaust memory are disabled, use --deqp-test-oom=enable command line option to enable."
                        );
    tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"OOM tests disabled",&local_1e9);
    tcu::NotSupportedError::NotSupportedError(this_03,&local_1e8);
    __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar3 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  this->m_display = pvVar3;
  do {
    (*pLStack_18->_vptr_Library[2])
              (pLStack_18,this->m_display,&local_38,&this->m_config,1,&local_1c);
    err = (*pLStack_18->_vptr_Library[0x1f])();
    eglu::checkError(err,"chooseConfig(m_display, attribList, &m_config, 1, &configCount)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                     ,0x177);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 && (local_1c != 0))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      return 0;
    }
  }
  this_04 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_04,(char *)0x0,"configCount != 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
             ,0x179);
  __cxa_throw(this_04,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void MemoryStressCase::init (void)
{
	const Library&	egl				= m_eglTestCtx.getLibrary();
	EGLint			configCount		= 0;
	const EGLint	attribList[]	=
	{
		EGL_SURFACE_TYPE,		EGL_PBUFFER_BIT,
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_NONE
	};

	if (!m_testCtx.getCommandLine().isOutOfMemoryTestEnabled())
	{
		m_testCtx.getLog() << TestLog::Message << "Tests that exhaust memory are disabled, use --deqp-test-oom=enable command line option to enable." << TestLog::EndMessage;
		throw tcu::NotSupportedError("OOM tests disabled");
	}

	m_display = eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());

	EGLU_CHECK_CALL(egl, chooseConfig(m_display, attribList, &m_config, 1, &configCount));

	TCU_CHECK(configCount != 0);
}